

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

ResourceAttribution * __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::
GetResourceAttribution<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>>
          (ResourceAttribution *__return_storage_ptr__,
          PipelineStateBase<Diligent::EngineGLImplTraits> *this,char *Name,SHADER_TYPE Stage,
          RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *pSignatures,Uint32 SignCount)

{
  PipelineResourceSignatureImplType *_pSignature;
  Uint32 _ResourceIndex;
  Uint32 _ImmutableSamplerIndex;
  undefined4 in_register_0000000c;
  ulong uVar1;
  string msg;
  
  if ((this == (PipelineStateBase<Diligent::EngineGLImplTraits> *)0x0) ||
     (*(char *)&(this->
                super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                ).super_ObjectBase<Diligent::IPipelineStateGL>.
                super_RefCountedObject<Diligent::IPipelineStateGL>.super_IPipelineStateGL.
                super_IPipelineState.super_IDeviceObject.super_IObject == '\0')) {
    FormatString<char[26],char[35]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",
               (char (*) [35])CONCAT44(in_register_0000000c,Stage));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetResourceAttribution",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x45a);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar1 = 0;
  do {
    if (((ulong)pSignatures & 0xffffffff) == uVar1) {
      __return_storage_ptr__->pSignature = (PipelineResourceSignatureImplType *)0x0;
      __return_storage_ptr__->SignatureIndex = 0xffffffff;
      __return_storage_ptr__->ResourceIndex = 0xffffffff;
      __return_storage_ptr__->ImmutableSamplerIndex = 0xffffffff;
      return __return_storage_ptr__;
    }
    _pSignature = *(PipelineResourceSignatureImplType **)
                   (*(char (*) [35])CONCAT44(in_register_0000000c,Stage) + uVar1 * 8);
    if (_pSignature != (PipelineResourceSignatureImplType *)0x0) {
      _ResourceIndex =
           PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::FindResource
                     (&_pSignature->
                       super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                      (SHADER_TYPE)Name,(char *)this);
      if (_ResourceIndex != 0xffffffff) {
        _ImmutableSamplerIndex = 0xffffffff;
LAB_002be698:
        ResourceAttribution::ResourceAttribution
                  (__return_storage_ptr__,_pSignature,(Uint32)uVar1,_ResourceIndex,
                   _ImmutableSamplerIndex);
        return __return_storage_ptr__;
      }
      _ImmutableSamplerIndex =
           PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::FindImmutableSampler
                     (&_pSignature->
                       super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                      (SHADER_TYPE)Name,(char *)this);
      if (_ImmutableSamplerIndex != 0xffffffff) {
        _ResourceIndex = 0xffffffff;
        goto LAB_002be698;
      }
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

static ResourceAttribution GetResourceAttribution(const char*                                Name,
                                                      SHADER_TYPE                                Stage,
                                                      const PipelineResourceSignatureImplPtrType pSignatures[],
                                                      Uint32                                     SignCount)
    {
        VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
        for (Uint32 sign = 0; sign < SignCount; ++sign)
        {
            const PipelineResourceSignatureImplType* const pSignature = pSignatures[sign];
            if (pSignature == nullptr)
                continue;

            const Uint32 ResIndex = pSignature->FindResource(Stage, Name);
            if (ResIndex != ResourceAttribution::InvalidResourceIndex)
                return ResourceAttribution{pSignature, sign, ResIndex};
            else
            {
                const Uint32 ImtblSamIndex = pSignature->FindImmutableSampler(Stage, Name);
                if (ImtblSamIndex != ResourceAttribution::InvalidSamplerIndex)
                    return ResourceAttribution{pSignature, sign, ResourceAttribution::InvalidResourceIndex, ImtblSamIndex};
            }
        }
        return ResourceAttribution{};
    }